

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

PackedData * __thiscall
soul::Value::PackedData::StructIterator::get
          (PackedData *__return_storage_ptr__,StructIterator *this)

{
  Member *pMVar1;
  uint8_t *puVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = this->index - 1;
  if ((this->structure->members).numActive <= uVar4) {
    throwInternalCompilerError("index < numActive","operator[]",0x9f);
  }
  pMVar1 = (this->structure->members).items;
  puVar2 = this->member;
  sVar3 = this->memberSize;
  __return_storage_ptr__->type = &pMVar1[uVar4].type;
  __return_storage_ptr__->data = puVar2;
  __return_storage_ptr__->size = sVar3;
  if ((pMVar1[uVar4].type.category != invalid) && (pMVar1[uVar4].type.primitiveType.type != void_))
  {
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("type.isValid() && ! type.isVoid()","PackedData",0x21);
}

Assistant:

PackedData get() const      { return PackedData (structure.getMemberType (index - 1), member, memberSize); }